

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnCheckpointState::~ArrayColumnCheckpointState(ArrayColumnCheckpointState *this)

{
  ~ArrayColumnCheckpointState(this);
  operator_delete(this);
  return;
}

Assistant:

ArrayColumnCheckpointState(RowGroup &row_group, ColumnData &column_data, PartialBlockManager &partial_block_manager)
	    : ColumnCheckpointState(row_group, column_data, partial_block_manager) {
		global_stats = ArrayStats::CreateEmpty(column_data.type).ToUnique();
	}